

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Config::readBazelEnvVars(Config *this)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  bazelShardingOptions *pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostream local_3c8 [8];
  ofstream f;
  undefined1 local_1c8 [8];
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> bazelShardOptions;
  value_type local_190;
  char *local_170;
  char *bazelTestSpec;
  _Rb_tree_node_base _Stack_160;
  size_t sStack_140;
  Optional<Catch::ColourMode> local_138;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  allocator<char> local_c1;
  string local_c0;
  ReporterSpec local_a0;
  char *local_18;
  char *bazelOutputFile;
  Config *this_local;
  
  bazelOutputFile = (char *)this;
  local_18 = Detail::getEnv("XML_OUTPUT_FILE");
  if (local_18 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"junit",&local_c1);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar1,&local_121);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Optional(&local_100,&local_120);
    Optional<Catch::ColourMode>::Optional(&local_138);
    _Stack_160._M_right = (_Base_ptr)0x0;
    sStack_140 = 0;
    _Stack_160._M_parent = (_Base_ptr)0x0;
    _Stack_160._M_left = (_Base_ptr)0x0;
    bazelTestSpec = (char *)0x0;
    _Stack_160._M_color = _S_red;
    _Stack_160._4_4_ = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&bazelTestSpec);
    ReporterSpec::ReporterSpec
              (&local_a0,&local_c0,&local_100,&local_138,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&bazelTestSpec);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::push_back
              (&(this->m_data).reporterSpecifications,&local_a0);
    ReporterSpec::~ReporterSpec(&local_a0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&bazelTestSpec);
    Optional<Catch::ColourMode>::~Optional(&local_138);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Optional(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  local_170 = Detail::getEnv("TESTBRIDGE_TEST_ONLY");
  if (local_170 != (char *)0x0) {
    this_00 = &(this->m_data).testsOrTags;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_00);
    pcVar1 = local_170;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,pcVar1,(allocator<char> *)(bazelShardOptions.storage + 0x27));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)(bazelShardOptions.storage + 0x27));
  }
  anon_unknown_26::readBazelShardingOptions();
  bVar2 = Catch::Optional::operator_cast_to_bool((Optional *)local_1c8);
  if (bVar2) {
    pbVar5 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                       ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)local_1c8);
    _Var4 = std::operator|(_S_out,_S_trunc);
    std::ofstream::ofstream(local_3c8,(string *)&pbVar5->shardFilePath,_Var4);
    bVar3 = std::ofstream::is_open();
    if ((bVar3 & 1) != 0) {
      std::operator<<(local_3c8,"");
      pbVar5 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                         ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)local_1c8)
      ;
      (this->m_data).shardIndex = pbVar5->shardIndex;
      pbVar5 = Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::operator->
                         ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)local_1c8)
      ;
      (this->m_data).shardCount = pbVar5->shardCount;
    }
    std::ofstream::~ofstream(local_3c8);
  }
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions>::~Optional
            ((Optional<Catch::(anonymous_namespace)::bazelShardingOptions> *)local_1c8);
  return;
}

Assistant:

void Config::readBazelEnvVars() {
        // Register a JUnit reporter for Bazel. Bazel sets an environment
        // variable with the path to XML output. If this file is written to
        // during test, Bazel will not generate a default XML output.
        // This allows the XML output file to contain higher level of detail
        // than what is possible otherwise.
        const auto bazelOutputFile = Detail::getEnv( "XML_OUTPUT_FILE" );

        if ( bazelOutputFile ) {
            m_data.reporterSpecifications.push_back(
                { "junit", std::string( bazelOutputFile ), {}, {} } );
        }

        const auto bazelTestSpec = Detail::getEnv( "TESTBRIDGE_TEST_ONLY" );
        if ( bazelTestSpec ) {
            // Presumably the test spec from environment should overwrite
            // the one we got from CLI (if we got any)
            m_data.testsOrTags.clear();
            m_data.testsOrTags.push_back( bazelTestSpec );
        }

        const auto bazelShardOptions = readBazelShardingOptions();
        if ( bazelShardOptions ) {
            std::ofstream f( bazelShardOptions->shardFilePath,
                             std::ios_base::out | std::ios_base::trunc );
            if ( f.is_open() ) {
                f << "";
                m_data.shardIndex = bazelShardOptions->shardIndex;
                m_data.shardCount = bazelShardOptions->shardCount;
            }
        }
    }